

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

void __thiscall
mjs::anon_unknown_46::stringify_state::call_replacer
          (stringify_state *this,value *v,wstring_view key,object_ptr *holder)

{
  initializer_list<mjs::value> __l;
  bool bVar1;
  gc_heap *h;
  value *local_168;
  allocator<mjs::value> local_14a;
  undefined1 local_149;
  string local_148;
  value *local_138;
  value local_130;
  value local_108;
  iterator local_e0;
  undefined1 local_d8 [48];
  value local_a8;
  value local_80;
  value local_58;
  object_ptr *local_30;
  object_ptr *holder_local;
  value *v_local;
  stringify_state *this_local;
  wstring_view key_local;
  
  key_local._M_len = (size_t)key._M_str;
  this_local = (stringify_state *)key._M_len;
  local_30 = holder;
  holder_local = (object_ptr *)v;
  v_local = (value *)this;
  bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool(&(this->replacer_).super_gc_heap_ptr_untyped);
  if (bVar1) {
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                      (&(this->replacer_).super_gc_heap_ptr_untyped);
    if (!bVar1) {
      __assert_fail("replacer_.has_type<function_object>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x20f,
                    "void mjs::(anonymous namespace)::stringify_state::call_replacer(value &, const std::wstring_view, const object_ptr &)"
                   );
    }
    value::value(&local_80,&this->replacer_);
    value::value(&local_a8,local_30);
    local_149 = 1;
    local_138 = &local_130;
    h = heap(this);
    string::string(&local_148,h,(wstring_view *)&this_local);
    value::value(&local_130,&local_148);
    local_138 = &local_108;
    value::value(local_138,(value *)holder_local);
    local_149 = 0;
    local_e0 = &local_130;
    local_d8._0_8_ = 9.88131291682493e-324;
    std::allocator<mjs::value>::allocator(&local_14a);
    __l._M_len = local_d8._0_8_;
    __l._M_array = local_e0;
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_d8 + 8),__l,&local_14a);
    call_function(&local_58,&local_80,&local_a8,
                  (vector<mjs::value,_std::allocator<mjs::value>_> *)(local_d8 + 8));
    value::operator=((value *)holder_local,&local_58);
    value::~value(&local_58);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_d8 + 8));
    std::allocator<mjs::value>::~allocator(&local_14a);
    local_168 = (value *)&local_e0;
    do {
      local_168 = local_168 + -1;
      value::~value(local_168);
    } while (local_168 != &local_130);
    string::~string(&local_148);
    value::~value(&local_a8);
    value::~value(&local_80);
  }
  return;
}

Assistant:

void call_replacer(value& v, const std::wstring_view key, const object_ptr& holder) {
        if (!replacer_) {
            return;
        }
        assert(replacer_.has_type<function_object>());
        v = call_function(value{replacer_}, value{holder}, {value{string{heap(), key}}, v});
    }